

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int query_category(char *qstr,obj *olist,int qflags,int *pick_list,int how)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  undefined4 *puVar11;
  int *piVar12;
  int iVar13;
  char *pcVar14;
  char *local_258;
  char *local_248;
  int local_238;
  int pick;
  int j;
  int i;
  char *failed_at;
  boolean add_bucs;
  boolean add_oclasses;
  boolean add_gold;
  boolean autosel_chosen;
  boolean oprop_chosen;
  boolean oclass_chosen;
  boolean gold_chosen;
  boolean all_chosen;
  nh_menuitem *_item__9;
  nh_menuitem *_item__8;
  nh_menuitem *_item__7;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  char buf [256];
  char oc_sym;
  nh_menuitem *_item_;
  int iStack_b8;
  int num_valid_oclasses;
  int valid_oclasses [18];
  menulist menu;
  int num_buc_types;
  boolean do_unidentified;
  boolean do_buc_unknown;
  boolean do_uncursed;
  boolean do_cursed;
  boolean do_blessed;
  boolean do_unpaid;
  int ccount;
  char invlet;
  boolean collected_type_name;
  char *pack;
  obj *curr;
  int n;
  int how_local;
  int *pick_list_local;
  int qflags_local;
  obj *olist_local;
  char *qstr_local;
  
  bVar2 = false;
  bVar4 = false;
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  bVar3 = false;
  menu.icount = 0;
  _item_._4_4_ = 0;
  if (olist == (obj *)0x0) {
    return 0;
  }
  if (((qflags & 2U) != 0) && (iVar10 = count_unpaid(olist), iVar10 != 0)) {
    bVar2 = true;
  }
  if (((qflags & 0x80U) != 0) && (iVar10 = count_buc(olist,0x80), iVar10 != 0)) {
    bVar4 = true;
    menu.icount = 1;
  }
  if (((qflags & 0x100U) != 0) && (iVar10 = count_buc(olist,0x100), iVar10 != 0)) {
    bVar5 = true;
    menu.icount = menu.icount + 1;
  }
  if (((qflags & 0x200U) != 0) && (iVar10 = count_buc(olist,0x200), iVar10 != 0)) {
    bVar6 = true;
    menu.icount = menu.icount + 1;
  }
  if (((qflags & 0x400U) != 0) && (iVar10 = count_buc(olist,0x400), iVar10 != 0)) {
    bVar7 = true;
    menu.icount = menu.icount + 1;
  }
  if (((qflags & 0x800U) != 0) && (iVar10 = count_buc(olist,0x800), iVar10 != 0)) {
    bVar3 = true;
  }
  iVar10 = count_categories(olist,qflags);
  if ((((iVar10 != 1) || (bVar2)) || (1 < (uint)menu.icount)) ||
     (pack = (char *)olist, (qflags & 0x20U) != 0)) {
    init_menulist((menulist *)(valid_oclasses + 0x10));
    _ccount = flags.inv_order;
    do_blessed = 'a';
    if (((qflags & 0x10U) != 0) && (1 < iVar10)) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0xfffffffe;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x61;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      pcVar14 = "All types";
      if ((qflags & 8U) != 0) {
        pcVar14 = "All worn types";
      }
      strcpy((char *)(puVar11 + 2),pcVar14);
      menu.items._4_4_ = menu.items._4_4_ + 1;
      do_blessed = 'b';
    }
    do {
      bVar8 = false;
      pack = (char *)olist;
      while (pack != (char *)0x0) {
        if (((pack[0x35] == *_ccount) &&
            (((qflags & 8U) == 0 || ((*(uint *)(pack + 0x60) & 0xf077f) != 0)))) && (!bVar8)) {
          cVar1 = ""[(int)objects[*(short *)(pack + 0x2a)].oc_class];
          pcVar14 = let_to_name(*_ccount,'\0');
          sprintf((char *)&_item__1,"%s  (\'%c\')",pcVar14,(ulong)(uint)(int)cVar1);
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            valid_oclasses._64_8_ =
                 realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c);
          }
          piVar12 = (int *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
          *piVar12 = (int)pack[0x35];
          piVar12[1] = 1;
          cVar9 = do_blessed + '\x01';
          *(boolean *)(piVar12 + 0x42) = do_blessed;
          *(undefined1 *)((long)piVar12 + 0x109) = 0;
          *(undefined1 *)((long)piVar12 + 0x10a) = 0;
          strcpy((char *)(piVar12 + 2),(char *)&_item__1);
          iVar10 = menu.items._4_4_ + 1;
          *(char *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c + 0x109) = cVar1;
          bVar8 = true;
          menu.items._4_4_ = iVar10;
          do_blessed = cVar9;
          if ((iflags.menu_match_tight != '\0') && (pack[0x35] != '\f')) {
            iVar10 = _item_._4_4_ + 1;
            (&iStack_b8)[_item_._4_4_] = (int)pack[0x35];
            _item_._4_4_ = iVar10;
            if (0x11 < iVar10) {
              free((void *)valid_oclasses._64_8_);
              impossible("query_category: too many oclasses");
              return 0;
            }
          }
        }
        if ((qflags & 1U) == 0) {
          local_258 = *(char **)pack;
        }
        else {
          local_258 = *(char **)(pack + 8);
        }
        pack = local_258;
      }
      _ccount = _ccount + 1;
      if ('t' < do_blessed) {
        free((void *)valid_oclasses._64_8_);
        impossible("query_category: too many categories");
        return 0;
      }
    } while (*_ccount != '\0');
    if (bVar2) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x75;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x75;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Unpaid items");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if ((qflags & 0x20U) != 0) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x78;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x78;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Unpaid items already used up");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if ((qflags & 0x40U) != 0) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x41;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x41;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      pcVar14 = "Auto-select every item";
      if ((qflags & 8U) != 0) {
        pcVar14 = "Auto-select every item being worn";
      }
      strcpy((char *)(puVar11 + 2),pcVar14);
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if (bVar3) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x49;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x49;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Unidentified Items");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if (bVar4) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x42;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x42;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Items known to be Blessed");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if (bVar5) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x43;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x43;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Items known to be Cursed");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if (bVar6) {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        valid_oclasses._64_8_ = realloc((void *)valid_oclasses._64_8_,(long)(int)menu.items * 0x10c)
        ;
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x55;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x55;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Items known to be Uncursed");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    if (bVar7) {
      if ((int)menu.items <= menu.items._4_4_) {
        valid_oclasses._64_8_ =
             realloc((void *)valid_oclasses._64_8_,(long)((int)menu.items << 1) * 0x10c);
      }
      puVar11 = (undefined4 *)(valid_oclasses._64_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar11 = 0x58;
      puVar11[1] = 1;
      *(undefined1 *)(puVar11 + 0x42) = 0x58;
      *(undefined1 *)((long)puVar11 + 0x109) = 0;
      *(undefined1 *)((long)puVar11 + 0x10a) = 0;
      strcpy((char *)(puVar11 + 2),"Items of unknown B/C/U status");
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    curr._0_4_ = display_menu((nh_menuitem *)valid_oclasses._64_8_,menu.items._4_4_,qstr,how,
                              pick_list);
    free((void *)valid_oclasses._64_8_);
    if ((int)curr < 0) {
      curr._0_4_ = 0;
    }
  }
  else {
    while (((pack != (char *)0x0 && ((qflags & 8U) != 0)) &&
           ((*(uint *)(pack + 0x60) & 0xf077f) == 0))) {
      if ((qflags & 1U) == 0) {
        local_248 = *(char **)pack;
      }
      else {
        local_248 = *(char **)(pack + 8);
      }
      pack = local_248;
    }
    if (pack == (char *)0x0) {
      return 0;
    }
    *pick_list = (int)pack[0x35];
    curr._0_4_ = 1;
  }
  if (iflags.menu_match_tight == '\0') {
    return (int)curr;
  }
  if ((int)curr < 1) {
    return (int)curr;
  }
  bVar3 = false;
  bVar4 = false;
  bVar2 = false;
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  _j = (char *)0x0;
  for (pick = 0; pick < (int)curr; pick = pick + 1) {
    iVar10 = pick_list[pick];
    local_238 = 0;
    while( true ) {
      bVar8 = false;
      if (local_238 < _item_._4_4_) {
        bVar8 = (bool)(bVar2 ^ 1);
      }
      if (!bVar8) break;
      if (iVar10 == (&iStack_b8)[local_238]) {
        bVar2 = true;
      }
      local_238 = local_238 + 1;
    }
    if (iVar10 == 0xc) {
      bVar4 = true;
    }
    else if (iVar10 == 0x41) {
      bVar6 = true;
    }
    else if (((iVar10 - 0x42U < 2) || (iVar10 == 0x49)) || ((iVar10 == 0x55 || (iVar10 == 0x58)))) {
LAB_0028a06a:
      bVar5 = true;
    }
    else if (iVar10 == 0x61) {
      bVar3 = true;
    }
    else if ((iVar10 == 0x75) || (iVar10 == 0x78)) goto LAB_0028a06a;
  }
  if (bVar3) {
    return (int)curr;
  }
  if (((bVar4) && (!bVar2)) && (!bVar5)) {
    return (int)curr;
  }
  if (((!bVar6) || (bVar4)) || ((bVar2 || (bVar5)))) {
    bVar2 = !bVar2;
    bVar5 = !bVar5;
  }
  else {
    bVar7 = true;
    bVar2 = true;
    bVar5 = true;
  }
  if (((int)curr < 0x1e) || (((!bVar7 && (!bVar2)) && (!bVar5)))) {
    if (bVar7) {
      pick_list[(int)curr] = 0xc;
      curr._0_4_ = (int)curr + 1;
    }
    if (((int)curr < 0x1e) || ((!bVar2 && (!bVar5)))) {
      if (bVar2) {
        for (local_238 = 0; local_238 < _item_._4_4_ && (int)curr < 0x1e; local_238 = local_238 + 1)
        {
          pick_list[(int)curr] = (&iStack_b8)[local_238];
          curr._0_4_ = (int)curr + 1;
        }
        if ((0x1d < (int)curr) && ((local_238 < _item_._4_4_ || (bVar5)))) {
          _j = "oclasses";
          goto LAB_0028a330;
        }
      }
      if (bVar5) {
        iVar10 = (int)curr + 1;
        pick_list[(int)curr] = 0x42;
        if (iVar10 < 0x1e) {
          iVar13 = (int)curr + 2;
          pick_list[iVar10] = 0x43;
          if (iVar13 < 0x1e) {
            iVar10 = (int)curr + 3;
            pick_list[iVar13] = 0x55;
            if (iVar10 < 0x1e) {
              curr._0_4_ = (int)curr + 4;
              pick_list[iVar10] = 0x58;
            }
            else {
              _j = "BUCs";
              curr._0_4_ = iVar10;
            }
          }
          else {
            _j = "BUCs";
            curr._0_4_ = iVar13;
          }
        }
        else {
          _j = "BUCs";
          curr._0_4_ = iVar10;
        }
      }
    }
    else {
      _j = "COIN_CLASS";
    }
  }
  else {
    _j = "anything";
  }
LAB_0028a330:
  if (_j != (char *)0x0) {
    warning("query_category: no room in pick_list to add %s",_j);
  }
  return (int)curr;
}

Assistant:

int query_category(const char *qstr,	/* query string */
		   struct obj *olist,	/* the list to pick from */
		   int qflags,		/* behaviour modification flags */
		   int *pick_list,	/* return list of items picked */
		   int how)		/* type of query */
{
	int n;
	struct obj *curr;
	char *pack;
	boolean collected_type_name;
	char invlet;
	int ccount;
	boolean do_unpaid = FALSE;
	boolean do_blessed = FALSE, do_cursed = FALSE, do_uncursed = FALSE,
	    do_buc_unknown = FALSE, do_unidentified = FALSE;
	int num_buc_types = 0;
	struct menulist menu;
	int valid_oclasses[MAXOCLASSES]; /* excludes COIN_CLASS */
	int num_valid_oclasses = 0;

	if (!olist)
	    return 0;
	if ((qflags & UNPAID_TYPES) && count_unpaid(olist))
	    do_unpaid = TRUE;
	if ((qflags & BUC_BLESSED) && count_buc(olist, BUC_BLESSED)) {
	    do_blessed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_CURSED) && count_buc(olist, BUC_CURSED)) {
	    do_cursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNCURSED) && count_buc(olist, BUC_UNCURSED)) {
	    do_uncursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNKNOWN) && count_buc(olist, BUC_UNKNOWN)) {
	    do_buc_unknown = TRUE;
	    num_buc_types++;
	}
	if ((qflags & UNIDENTIFIED) && count_buc(olist, UNIDENTIFIED))
	    do_unidentified = TRUE;

	ccount = count_categories(olist, qflags);
	/* no point in actually showing a menu for a single category */
	if (ccount == 1 && !do_unpaid && num_buc_types <= 1 &&
	    !(qflags & BILLED_TYPES)) {
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if ((qflags & WORN_TYPES) &&
		    !(curr->owornmask & (W_ARMOR|W_RING|W_AMUL|W_TOOL|W_WEP|W_SWAPWEP|W_QUIVER)))
		    continue;
		break;
	    }
	    if (curr) {
		pick_list[0] = curr->oclass;
		n = 1;
		goto fudge_choices;
	    }
	    return 0;
	}
	
	init_menulist(&menu);

	pack = flags.inv_order;
	invlet = 'a';
	if ((qflags & ALL_TYPES) && (ccount > 1)) {
		add_menuitem(&menu, ALL_TYPES_SELECTED, (qflags & WORN_TYPES) ?
		             "All worn types" : "All types", invlet, FALSE);
		invlet = 'b';
	}
	
	do {
	    collected_type_name = FALSE;
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if (curr->oclass == *pack) {
		   if ((qflags & WORN_TYPES) &&
		   		!(curr->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL |
		    	W_WEP | W_SWAPWEP | W_QUIVER)))
			 continue;
		   if (!collected_type_name) {
			char oc_sym, buf[BUFSZ];
			oc_sym = def_oc_syms[(int)objects[curr->otyp].oc_class];
			sprintf(buf, "%s  ('%c')", let_to_name(*pack, FALSE), oc_sym);
			add_menuitem(&menu, curr->oclass, buf, invlet++, FALSE);
			menu.items[menu.icount - 1].group_accel = oc_sym;
			collected_type_name = TRUE;
			/* Gold is handled separately. */
			if (iflags.menu_match_tight && curr->oclass != COIN_CLASS) {
			    valid_oclasses[num_valid_oclasses++] = curr->oclass;
			    if (num_valid_oclasses >= MAXOCLASSES) {
				free(menu.items);
				impossible("query_category: too many oclasses");
				return 0;
			    }
			}
		   }
		}
	    }
	    pack++;
	    if (invlet >= 'u') {
		free(menu.items);
		impossible("query_category: too many categories");
		return 0;
	    }
	} while (*pack);
	/* unpaid items if there are any */
	if (do_unpaid)
	    add_menuitem(&menu, 'u', "Unpaid items", 'u', FALSE);
	
	/* billed items: checked by caller, so always include if BILLED_TYPES */
	if (qflags & BILLED_TYPES)
	    add_menuitem(&menu, 'x', "Unpaid items already used up", 'x', FALSE);
	
	if (qflags & CHOOSE_ALL)
	    add_menuitem(&menu, 'A', (qflags & WORN_TYPES) ?
		    "Auto-select every item being worn" :
		    "Auto-select every item", 'A', FALSE);
	
	if (do_unidentified)
	    add_menuitem(&menu, 'I', "Unidentified Items", 'I', FALSE);
	
	/* items with b/u/c/unknown if there are any */
	if (do_blessed)
	    add_menuitem(&menu, 'B', "Items known to be Blessed", 'B', FALSE);
	
	if (do_cursed)
	    add_menuitem(&menu, 'C', "Items known to be Cursed", 'C', FALSE);
	
	if (do_uncursed)
	    add_menuitem(&menu, 'U', "Items known to be Uncursed", 'U', FALSE);
	
	if (do_buc_unknown)
	    add_menuitem(&menu, 'X', "Items of unknown B/C/U status", 'X', FALSE);
	
	n = display_menu(menu.items, menu.icount, qstr, how, pick_list);
	free(menu.items);
	if (n < 0)
	    n = 0;	/* callers don't expect -1 */

	/*
	 * Fudge menu choices since allow_category() requires at least
	 * an object class and some object property to show anything.
	 *
	 * - Choosing all [a] goes through allow_all(), which skips all of this.
	 * - Choosing gold [$] always shows gold, since it's not subjected
	 *   the usual property checks.
	 * - Choosing only gold [$] excludes all other objects.
	 * - Auto-select all with nothing else includes gold and all objects.
	 * - Choosing classes w/out properties auto-matches any BUC to match
	 *   all objects of that class.
	 * - Choosing properties w/out classes auto-matches all classes to match
	 *   all objects with those properties.
	 */
fudge_choices:
	if (iflags.menu_match_tight && n > 0) {
	    boolean all_chosen = FALSE;
	    boolean gold_chosen = FALSE;
	    boolean oclass_chosen = FALSE;
	    boolean oprop_chosen = FALSE;
	    boolean autosel_chosen = FALSE;
	    boolean add_gold = FALSE;
	    boolean add_oclasses = FALSE;
	    boolean add_bucs = FALSE;
	    const char *failed_at = NULL; /* 30 == hard-coded pick_list[] length */
	    int i, j;

	    /* Analyze menu choices. */
	    for (i = 0; i < n; i++) {
		int pick = pick_list[i];
		for (j = 0; j < num_valid_oclasses && !oclass_chosen; j++) {
		    if (pick == valid_oclasses[j])
			oclass_chosen = TRUE;
		}
		switch (pick) {
		case 'a':
		    all_chosen = TRUE;
		    break;
		case COIN_CLASS:
		    gold_chosen = TRUE;
		    break;
		case 'B': case 'C': case 'U': case 'X':
		case 'u': case 'x': case 'I':
		    oprop_chosen = TRUE;
		    break;
		case 'A':
		    autosel_chosen = TRUE;
		    break;
		}
	    }

	    /* Choosing all [a] means no special fudging is needed. */
	    if (all_chosen)
		return n;

	    /* If only gold is chosen, don't show anything else. */
	    if (gold_chosen && !(oclass_chosen || oprop_chosen))
		return n;

	    if (autosel_chosen && !(gold_chosen || oclass_chosen || oprop_chosen)) {
		/* If only auto-select all is chosen, add everything. */
		add_gold = TRUE;
		add_oclasses = TRUE;
		add_bucs = TRUE;
	    } else {
		/* Add all oclasses if needed. */
		if (!oclass_chosen)
		    add_oclasses = TRUE;
		/* Add all BUCs if no oprops were chosen. */
		if (!oprop_chosen)
		    add_bucs = TRUE;
	    }

	    if (n >= 30 && (add_gold || add_oclasses || add_bucs)) {
		failed_at = "anything";
		goto append_fail;
	    }

	    if (add_gold)
		pick_list[n++] = COIN_CLASS;
	    if (n >= 30 && (add_oclasses || add_bucs)) {
		failed_at = "COIN_CLASS";
		goto append_fail;
	    }

	    if (add_oclasses) {
		for (j = 0; j < num_valid_oclasses && n < 30; j++)
		    pick_list[n++] = valid_oclasses[j];
		if (n >= 30 && (j < num_valid_oclasses || add_bucs)) {
		    failed_at = "oclasses";
		    goto append_fail;
		}
	    }

	    if (add_bucs) {
		pick_list[n++] = 'B';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'C';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'U';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'X';
	    }

append_fail:
	    if (failed_at)
		warning("query_category: no room in pick_list to add %s", failed_at);
	}

	return n;
}